

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

void __thiscall spvtools::opt::analysis::ArrayConstant::~ArrayConstant(ArrayConstant *this)

{
  ArrayConstant *this_local;
  
  ~ArrayConstant(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

ArrayConstant(const Array* ty) : CompositeConstant(ty) {}